

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void cryptopro_key_meshing(gost_ctx *ctx,uchar *iv)

{
  undefined8 *in_RSI;
  uchar newiv [8];
  uchar newkey [32];
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  gost_ctx *in_stack_ffffffffffffffc0;
  byte *in_stack_ffffffffffffffc8;
  gost_ctx *in_stack_ffffffffffffffd0;
  
  gost_dec(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(byte *)in_stack_ffffffffffffffc0,
           in_stack_ffffffffffffffbc);
  gost_key(in_stack_ffffffffffffffc0,
           (byte *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  OPENSSL_cleanse(&stack0xffffffffffffffc8,0x20);
  if (in_RSI != (undefined8 *)0x0) {
    gostcrypt(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(byte *)in_stack_ffffffffffffffc0)
    ;
    *in_RSI = in_stack_ffffffffffffffc0;
    OPENSSL_cleanse(&stack0xffffffffffffffc0,8);
  }
  return;
}

Assistant:

void cryptopro_key_meshing(gost_ctx * ctx, unsigned char *iv)
{
    unsigned char newkey[32];
    /* Set static keymeshing key */
    /* "Decrypt" key with keymeshing key */
    gost_dec(ctx, CryptoProKeyMeshingKey, newkey, 4);
    /* set new key */
    gost_key(ctx, newkey);
    OPENSSL_cleanse(newkey, sizeof(newkey));
    /* Encrypt iv with new key */
    if (iv != NULL ) {
        unsigned char newiv[8];
        gostcrypt(ctx, iv, newiv);
        memcpy(iv, newiv, 8);
        OPENSSL_cleanse(newiv, sizeof(newiv));
    }
}